

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::royFloyd(Graph<Node> *this)

{
  vector<int> *pvVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  vector<vector<vector<int>_>_> dp;
  
  vector<vector<vector<int>_>_>::vector(&dp);
  vector<vector<vector<int>_>_>::resize(&dp,this->_nodeCnt);
  uVar7 = (ulong)(uint)this->_nodeCnt;
  for (lVar13 = 0; lVar13 < (int)uVar7; lVar13 = lVar13 + 1) {
    vector<vector<int>_>::resize(dp.vect + lVar13,(int)uVar7);
    lVar11 = 0;
    lVar12 = 0;
    while( true ) {
      uVar7 = (ulong)this->_nodeCnt;
      if ((long)uVar7 <= lVar12) break;
      vector<int>::resize((vector<int> *)((long)&(dp.vect[lVar13].vect)->vect + lVar11),
                          this->_nodeCnt);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x10;
    }
  }
  for (lVar13 = 0; lVar13 < (int)uVar7; lVar13 = lVar13 + 1) {
    for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
      iVar8 = 0x3f3f3f3f;
      if (lVar11 == lVar13) {
        iVar8 = 0;
      }
      *dp.vect[lVar13].vect[lVar11].vect = iVar8;
      uVar7 = (ulong)(uint)this->_nodeCnt;
    }
  }
  pvVar1 = (this->nextNodeInPath).vect;
  piVar5 = &((this->edges).vect)->_cost;
  for (lVar13 = 0; lVar13 < (this->edges)._size; lVar13 = lVar13 + 1) {
    iVar8 = ((Edge *)(piVar5 + -2))->_nodeS;
    iVar4 = piVar5[-1];
    iVar9 = *piVar5;
    piVar2 = dp.vect[iVar8].vect[iVar4].vect;
    iVar6 = *piVar2;
    if (iVar9 <= iVar6) {
      iVar6 = iVar9;
    }
    *piVar2 = iVar6;
    piVar2 = dp.vect[iVar4].vect[iVar8].vect;
    iVar6 = *piVar2;
    if (iVar6 < iVar9) {
      iVar9 = iVar6;
    }
    *piVar2 = iVar9;
    pvVar1[iVar8].vect[iVar4] = iVar4;
    pvVar1[iVar4].vect[iVar8] = iVar8;
    piVar5 = piVar5 + 3;
  }
  iVar8 = this->_nodeCnt;
  for (lVar13 = 1; lVar13 <= iVar8; lVar13 = lVar13 + 1) {
    for (lVar11 = 0; lVar11 < iVar8; lVar11 = lVar11 + 1) {
      pvVar1 = (this->nextNodeInPath).vect;
      lVar12 = 0;
      for (lVar10 = 0; lVar10 < iVar8; lVar10 = lVar10 + 1) {
        iVar4 = *(int *)(*(long *)((long)&(dp.vect[lVar13 + -1].vect)->vect + lVar12 * 4) + -4 +
                        lVar13 * 4) + dp.vect[lVar11].vect[lVar13 + -1].vect[lVar13 + -1];
        lVar3 = *(long *)((long)&(dp.vect[lVar11].vect)->vect + lVar12 * 4);
        iVar8 = *(int *)(lVar3 + -4 + lVar13 * 4);
        if (iVar4 < iVar8) {
          *(int *)(lVar3 + lVar13 * 4) = iVar4;
          piVar5 = pvVar1[lVar11].vect;
          *(int *)((long)piVar5 + lVar12) = piVar5[lVar13 + -1];
        }
        else {
          *(int *)(lVar3 + lVar13 * 4) = iVar8;
        }
        iVar8 = this->_nodeCnt;
        lVar12 = lVar12 + 4;
      }
    }
  }
  for (lVar13 = 0; lVar13 < iVar8; lVar13 = lVar13 + 1) {
    pvVar1 = (this->minDist).vect;
    lVar11 = 0;
    for (lVar12 = 0; lVar12 < iVar8; lVar12 = lVar12 + 1) {
      iVar8 = *(int *)(*(long *)((long)&(dp.vect[lVar13].vect)->vect + lVar11 * 4) + (long)iVar8 * 4
                      );
      if (iVar8 == 0x3f3f3f3f) {
        iVar8 = -1;
      }
      *(int *)((long)pvVar1[lVar13].vect + lVar11) = iVar8;
      iVar8 = this->_nodeCnt;
      lVar11 = lVar11 + 4;
    }
  }
  vector<vector<vector<int>_>_>::~vector(&dp);
  return;
}

Assistant:

void royFloyd() {
        const int Inf = 0x3f3f3f3f;

        //make dp
        vector<vector<vector<int>>> dp;
        dp.resize(_nodeCnt);
        for (int i = 0; i < _nodeCnt; ++i) {
            dp[i].resize(_nodeCnt);
            for (int j = 0; j < _nodeCnt; ++j) {
                dp[i][j].resize(_nodeCnt);
            }
        }

        //initialize dp
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (i == j) {
                    dp[i][j][0] = 0;
                }
                else {
                    dp[i][j][0] = Inf;
                }
            }
        }

        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();
            int cost = currEdge.getCost();

            dp[source][dest][0] = min(dp[source][dest][0], cost);
            dp[dest][source][0] = min(dp[dest][source][0], cost);

            nextNodeInPath[source][dest] = dest;
            nextNodeInPath[dest][source] = source;
        }

        //calc dp (nodes added from 0 to k - 1 (+1) ||| 0 means no nodes added)
        for (int k = 1; k <= _nodeCnt; ++k) {
            for (int i = 0; i < _nodeCnt; ++i) {
                for (int j = 0; j < _nodeCnt; ++j) {
                    int kAdded = dp[i][k - 1][k - 1] + dp[k - 1][j][k - 1];
                    int kNotAdded = dp[i][j][k - 1];
                    if (kAdded < kNotAdded) {
                        dp[i][j][k] = kAdded;
                        nextNodeInPath[i][j] = nextNodeInPath[i][k - 1];
                    }
                    else {
                        dp[i][j][k] = kNotAdded;
                    }
                }
            }
        }

        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (dp[i][j][_nodeCnt] == Inf) {
                    minDist[i][j] = -1;
                }
                else {
                    minDist[i][j] = dp[i][j][_nodeCnt];
                }
            }
        }
    }